

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_markers.cpp
# Opt level: O1

DASHEventMessageBoxv1 *
generate_event_message_vtt_time
          (DASHEventMessageBoxv1 *__return_storage_ptr__,uint32_t id,uint64_t presentation_time,
          uint64_t duration,uint32_t timescale,uint32_t off)

{
  uint32_t uVar1;
  string *this;
  uint64_t uVar2;
  tm *__tp;
  int k;
  long lVar3;
  time_t epochTime;
  char timestamp [64];
  uchar local_169;
  uint32_t local_168;
  uint32_t local_164;
  long local_160;
  string *local_158;
  string *local_150;
  string *local_148;
  string *local_140;
  string *local_138;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_130;
  undefined1 *local_128;
  uint64_t local_120;
  uint64_t local_118;
  long local_110;
  undefined **local_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  undefined8 local_e8;
  ulong auStack_e0 [2];
  undefined8 local_d0;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  void *local_c0;
  undefined2 uStack_b8;
  undefined6 uStack_b6;
  undefined2 local_b0;
  undefined6 uStack_ae;
  undefined2 local_a8;
  undefined1 local_a6;
  undefined1 uStack_a5;
  undefined6 uStack_a4;
  undefined2 uStack_9e;
  undefined8 local_9c;
  undefined8 uStack_94;
  uint32_t local_8c;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  void *local_48;
  undefined8 uStack_40;
  long local_38;
  
  (__return_storage_ptr__->super_full_box).super_box.size_ = 0;
  (__return_storage_ptr__->super_full_box).super_box.large_size_ = 0;
  local_140 = (string *)&(__return_storage_ptr__->super_full_box).super_box.box_type_;
  (__return_storage_ptr__->super_full_box).super_box.box_type_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_full_box).super_box.box_type_.field_2;
  (__return_storage_ptr__->super_full_box).super_box.box_type_._M_string_length = 0;
  (__return_storage_ptr__->super_full_box).super_box.box_type_.field_2._M_local_buf[0] = '\0';
  local_130 = &(__return_storage_ptr__->super_full_box).super_box.box_data_;
  (__return_storage_ptr__->super_full_box).super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_full_box).super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_full_box).super_box.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_full_box).super_box.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (__return_storage_ptr__->super_full_box).super_box.field_0x62 = 0;
  *(undefined8 *)&(__return_storage_ptr__->super_full_box).super_box.field_0x64 = 0;
  (__return_storage_ptr__->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_00121a88;
  local_148 = (string *)&__return_storage_ptr__->scheme_id_uri_;
  local_150 = (string *)0x80;
  (__return_storage_ptr__->scheme_id_uri_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->scheme_id_uri_).field_2;
  (__return_storage_ptr__->scheme_id_uri_)._M_string_length = 0;
  (__return_storage_ptr__->scheme_id_uri_).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->value_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value_).field_2;
  local_138 = (string *)&__return_storage_ptr__->value_;
  local_158 = (string *)0xa0;
  (__return_storage_ptr__->value_)._M_string_length = 0;
  (__return_storage_ptr__->value_).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->message_data_).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->message_data_).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->message_data_).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_160 = 0xc0;
  local_168 = id;
  local_164 = timescale;
  local_120 = duration;
  local_118 = presentation_time;
  memset(&local_108,0,0xd8);
  this = local_148;
  uStack_100 = (ulong)uStack_100._4_4_ << 0x20;
  uStack_f8 = 0;
  local_f0 = auStack_e0;
  local_e8 = 0;
  auStack_e0[0] = auStack_e0[0] & 0xffffffffffffff00;
  local_c0 = (void *)0x0;
  uStack_b8 = 0;
  uStack_b6 = 0;
  local_b0 = 0;
  uStack_ae = 0;
  local_a8 = 0;
  local_a6 = 0;
  uStack_a4 = 0;
  uStack_9e = 0;
  local_108 = &PTR_size_00121a88;
  local_150 = (string *)((long)local_150 + (long)&local_108);
  local_128 = &local_78;
  local_80 = 0;
  local_78 = 0;
  local_158 = (string *)((long)local_158 + (long)&local_108);
  local_60 = 0;
  local_58 = 0;
  local_160 = local_160 + (long)&local_108;
  local_38 = 0;
  local_48 = (void *)0x0;
  uStack_40 = 0;
  *(long *)&(__return_storage_ptr__->super_full_box).super_box.size_ = uStack_100;
  (__return_storage_ptr__->super_full_box).super_box.large_size_ = 0;
  local_88 = local_128;
  local_68 = &local_58;
  std::__cxx11::string::operator=(local_140,(string *)&local_f0);
  *(undefined4 *)(__return_storage_ptr__->super_full_box).super_box.extended_type_ =
       (undefined4)local_d0;
  *(undefined4 *)((__return_storage_ptr__->super_full_box).super_box.extended_type_ + 4) =
       local_d0._4_4_;
  *(undefined4 *)((__return_storage_ptr__->super_full_box).super_box.extended_type_ + 8) = uStack_c8
  ;
  *(undefined4 *)((__return_storage_ptr__->super_full_box).super_box.extended_type_ + 0xc) =
       uStack_c4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(local_130,&local_c0);
  (__return_storage_ptr__->super_full_box).super_box.is_large_ = (bool)(undefined1)local_a8;
  (__return_storage_ptr__->super_full_box).super_box.has_uuid_ = (bool)local_a8._1_1_;
  *(ulong *)&(__return_storage_ptr__->super_full_box).super_box.field_0x62 =
       CONCAT62(uStack_a4,CONCAT11(uStack_a5,local_a6));
  *(undefined2 *)((long)&(__return_storage_ptr__->super_full_box).magic_conf_ + 2) = uStack_9e;
  *(undefined8 *)&(__return_storage_ptr__->super_full_box).field_0x6c = local_9c;
  *(undefined8 *)((long)&__return_storage_ptr__->presentation_time_ + 4) = uStack_94;
  __return_storage_ptr__->id_ = local_8c;
  std::__cxx11::string::operator=(this,local_150);
  std::__cxx11::string::operator=(local_138,local_158);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&__return_storage_ptr__->message_data_);
  local_108 = &PTR_size_00121a88;
  if (local_48 != (void *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  uVar2 = local_118;
  uVar1 = local_164;
  if (local_88 != local_128) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  local_108 = &PTR_size_00121ad0;
  if (local_c0 != (void *)0x0) {
    operator_delete(local_c0,CONCAT62(uStack_ae,local_b0) - (long)local_c0);
  }
  if (local_f0 != auStack_e0) {
    operator_delete(local_f0,auStack_e0[0] + 1);
  }
  __return_storage_ptr__->id_ = local_168;
  __return_storage_ptr__->presentation_time_ = uVar2;
  __return_storage_ptr__->event_duration_ = (uint32_t)local_120;
  *(uint32_t *)&(__return_storage_ptr__->super_full_box).field_0x6c = uVar1;
  std::__cxx11::string::_M_replace
            ((ulong)this,0,(char *)(__return_storage_ptr__->scheme_id_uri_)._M_string_length,
             0x11a051);
  auStack_e0[1] = 0;
  local_d0 = 0;
  local_e8 = 0;
  auStack_e0[0] = 0;
  uStack_f8 = 0;
  local_f0 = (ulong *)0x0;
  local_108 = (undefined **)0x0;
  uStack_100 = 0;
  local_110 = (long)uVar2 / (long)(ulong)uVar1;
  __tp = gmtime(&local_110);
  strftime((char *)&local_108,0x40,"%Y-%m-%d %H:%M:%S",__tp);
  lVar3 = 0;
  do {
    local_169 = *(uchar *)((long)&local_108 + lVar3);
    if (local_169 != '\0') {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&__return_storage_ptr__->message_data_,&local_169);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x40);
  return __return_storage_ptr__;
}

Assistant:

event_track::DASHEventMessageBoxv1 generate_event_message_vtt_time(
    uint32_t id,
    uint64_t presentation_time,
    uint64_t duration,
    uint32_t timescale,
    uint32_t off)
{

    event_track::DASHEventMessageBoxv1 ev;
    ev = {};
    ev.id_ = id;
    ev.presentation_time_ = presentation_time;
    ev.event_duration_ = (uint32_t)duration;
    ev.timescale_ = timescale;
    ev.scheme_id_uri_ = "urn:webvtt";

    //static std::string getTimeStamp(time_t epochTime, const char* format = "%Y-%m-%d %H:%M:%S")
    //{
    char timestamp[64] = { 0 };
    const char* format = "%Y-%m-%d %H:%M:%S";
    std::time_t epochTime = (time_t) presentation_time / timescale;
    std::strftime(timestamp, sizeof(timestamp), format, gmtime(&epochTime));
    
    for (int k = 0; k < 64; k++)
        if(timestamp[k] != '\0')
           ev.message_data_.push_back(timestamp[k]);

    return ev;
}